

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O3

void Llb_ManPrintHisto(Llb_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  int iGroup;
  ulong uVar5;
  
  pAVar3 = p->pAig;
  pVVar4 = pAVar3->vObjs;
  if (0 < pVVar4->nSize) {
    uVar5 = 0;
    do {
      if (pVVar4->pArray[uVar5] != (void *)0x0) {
        if ((long)p->vObj2Var->nSize <= (long)uVar5) {
LAB_00931543:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (-1 < p->vObj2Var->pArray[uVar5]) {
          printf("%3d :",uVar5 & 0xffffffff);
          pVVar2 = p->vVarBegs;
          if ((long)pVVar2->nSize <= (long)uVar5) goto LAB_00931543;
          iGroup = 0;
          while (iGroup < pVVar2->pArray[uVar5]) {
            putchar(0x20);
            iGroup = iGroup + 1;
            pVVar2 = p->vVarBegs;
            if ((long)pVVar2->nSize <= (long)uVar5) goto LAB_00931543;
          }
          while( true ) {
            if ((long)p->vVarEnds->nSize <= (long)uVar5) goto LAB_00931543;
            if (p->vVarEnds->pArray[uVar5] < iGroup) break;
            iVar1 = Llb_ManGroupHasVar(p,iGroup,(int)uVar5);
            putchar((uint)(iVar1 == 0) * 3 + 0x2a);
            iGroup = iGroup + 1;
          }
          putchar(10);
          pAVar3 = p->pAig;
        }
      }
      uVar5 = uVar5 + 1;
      pVVar4 = pAVar3->vObjs;
    } while ((long)uVar5 < (long)pVVar4->nSize);
  }
  return;
}

Assistant:

void Llb_ManPrintHisto( Llb_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, k;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( Vec_IntEntry(p->vObj2Var, i) < 0 )
            continue;
        printf( "%3d :", i );
        for ( k = 0; k < Vec_IntEntry(p->vVarBegs, i); k++ )
            printf( " " );
        for (      ; k <= Vec_IntEntry(p->vVarEnds, i); k++ )
            printf( "%c", Llb_ManGroupHasVar(p, k, i)? '*':'-' );
        printf( "\n" );
    }
}